

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellANCF_3833.cpp
# Opt level: O2

ChMatrix33<double> * __thiscall
chrono::fea::ChElementShellANCF_3833::GetGreenLagrangeStrain
          (ChMatrix33<double> *__return_storage_ptr__,ChElementShellANCF_3833 *this,double xi,
          double eta,double zeta)

{
  ChMatrix33<double> I3x3;
  ChMatrixNMc<double,_3,_3> F;
  ChMatrix33<double> J_0xi;
  Matrix3xN e_bar;
  MatrixNx3c Sxi_D;
  double local_640;
  NoAlias<Eigen::Matrix<double,3,3,1,3,3>,Eigen::MatrixBase> *local_638;
  NoAlias<Eigen::Matrix<double,3,3,1,3,3>,Eigen::MatrixBase> *local_630;
  DenseBase<Eigen::Product<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_Eigen::Matrix<double,_24,_3,_0,_24,_3>,_0>_>
  *local_628;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
  local_618;
  Product<Eigen::Matrix<double,_24,_3,_0,_24,_3>,_Eigen::Inverse<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_0>
  *local_5d8;
  Matrix<double,_24,_3,_0,_24,_3> *local_5d0;
  Matrix<double,_3,_3,_1,_3,_3> *local_590 [9];
  Matrix<double,_3,_3,_1,_3,_3> local_548;
  Product<Eigen::Matrix<double,_24,_3,_0,_24,_3>,_Eigen::Inverse<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_0>
  local_500 [36];
  Matrix<double,_24,_3,_0,_24,_3> local_2c0;
  
  Calc_Sxi_D(this,&local_2c0,xi,eta,zeta,this->m_thicknessZ,this->m_midsurfoffset);
  local_500[0].m_lhs = (LhsNested)&this->m_ebar0;
  local_590[0] = &local_548;
  local_500[0].m_rhs.m_xpr = (XprTypeNested)&local_2c0;
  Eigen::NoAlias<Eigen::Matrix<double,3,3,1,3,3>,Eigen::MatrixBase>::operator=
            ((NoAlias<Eigen::Matrix<double,3,3,1,3,3>,Eigen::MatrixBase> *)local_590,
             (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_Eigen::Matrix<double,_24,_3,_0,_24,_3>,_0>_>
              *)local_500);
  local_500[0].m_lhs = &local_2c0;
  local_500[0].m_rhs.m_xpr = &local_548;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,24,3,0,24,3>,Eigen::Product<Eigen::Matrix<double,24,3,0,24,3>,Eigen::Inverse<Eigen::Matrix<double,3,3,1,3,3>>,0>>
            (&local_2c0,local_500);
  CalcCoordMatrix(this,(Matrix3xN *)local_500);
  local_5d8 = local_500;
  local_5d0 = &local_2c0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>>::
  _set_noalias<Eigen::Product<Eigen::Matrix<double,3,24,1,3,24>,Eigen::Matrix<double,24,3,0,24,3>,0>>
            ((PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> *)local_590,
             (DenseBase<Eigen::Product<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_Eigen::Matrix<double,_24,_3,_0,_24,_3>,_0>_>
              *)&local_5d8);
  Eigen::internal::setIdentity_impl<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_false>::run
            ((Matrix<double,_3,_3,_1,_3,_3> *)&local_5d8);
  local_640 = 0.5;
  local_638 = (NoAlias<Eigen::Matrix<double,3,3,1,3,3>,Eigen::MatrixBase> *)local_590;
  local_630 = (NoAlias<Eigen::Matrix<double,3,3,1,3,3>,Eigen::MatrixBase> *)local_590;
  local_628 = (DenseBase<Eigen::Product<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_Eigen::Matrix<double,_24,_3,_0,_24,_3>,_0>_>
               *)&local_5d8;
  Eigen::operator*(&local_618,&local_640,(StorageBaseType *)&local_638);
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,3,1,3,3>>::
  _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>,Eigen::Matrix<double,3,3,0,3,3>,0>const,Eigen::Matrix<double,3,3,1,3,3>const>const>>
            ((PlainObjectBase<Eigen::Matrix<double,3,3,1,3,3>> *)__return_storage_ptr__,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>_>
              *)&local_618);
  return __return_storage_ptr__;
}

Assistant:

ChMatrix33<> ChElementShellANCF_3833::GetGreenLagrangeStrain(const double xi, const double eta, const double zeta) {
    MatrixNx3c Sxi_D;  // Matrix of normalized shape function derivatives
    Calc_Sxi_D(Sxi_D, xi, eta, zeta, m_thicknessZ, m_midsurfoffset);

    ChMatrix33<double> J_0xi;  // Element Jacobian between the reference configuration and normalized configuration
    J_0xi.noalias() = m_ebar0 * Sxi_D;

    Sxi_D = Sxi_D * J_0xi.inverse();  // Adjust the shape function derivative matrix to account for the potentially
                                      // distorted reference configuration

    Matrix3xN e_bar;  // Element coordinates in matrix form
    CalcCoordMatrix(e_bar);

    // Calculate the Deformation Gradient at the current point
    ChMatrixNMc<double, 3, 3> F = e_bar * Sxi_D;

    ChMatrix33<> I3x3;
    I3x3.setIdentity();
    return 0.5 * (F.transpose() * F - I3x3);
}